

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

bool __thiscall
LinearSystem::ApplyOperation
          (LinearSystem *this,OperationType operation_type,int lhs,int rhs,Fraction coefficient)

{
  bool bVar1;
  int iVar2;
  Matrix *this_00;
  bool local_3d;
  int m;
  bool result;
  int rhs_local;
  int lhs_local;
  OperationType operation_type_local;
  LinearSystem *this_local;
  Fraction coefficient_local;
  
  if (operation_type == AddRow) {
    coefficient_local.numerator_._3_1_ = ExtendedMatrix::AddRow(&this->system_,lhs,rhs,coefficient);
  }
  else if (operation_type == MultiplyRow) {
    coefficient_local.numerator_._3_1_ = ExtendedMatrix::MultiplyRow(&this->system_,lhs,coefficient)
    ;
  }
  else if (operation_type == SwapRows) {
    local_3d = ExtendedMatrix::SwapRows(&this->system_,lhs,rhs);
    if (this->mode_ == LU) {
      this_00 = ExtendedMatrix::GetMainMatrix(&this->system_);
      iVar2 = Matrix::GetNumColumns(this_00);
      bVar1 = ExtendedMatrix::SwapColumns(&this->system_,lhs + iVar2,rhs + iVar2);
      local_3d = local_3d || bVar1;
    }
    coefficient_local.numerator_._3_1_ = local_3d;
  }
  else if (operation_type == SwapColumns) {
    coefficient_local.numerator_._3_1_ = ExtendedMatrix::SwapColumns(&this->system_,lhs,rhs);
  }
  else {
    coefficient_local.numerator_._3_1_ = false;
  }
  return coefficient_local.numerator_._3_1_;
}

Assistant:

bool LinearSystem::ApplyOperation(OperationType operation_type, int lhs, int rhs,
                                  Fraction coefficient) {
  if (operation_type == OperationType::AddRow) {
    return system_.AddRow(lhs, rhs, coefficient);
  } else if (operation_type == OperationType::MultiplyRow) {
    return system_.MultiplyRow(lhs, coefficient);
  } else if (operation_type == OperationType::SwapRows) {
    bool result = false;
    result |= system_.SwapRows(lhs, rhs);
    if (mode_ == Mode::LU){
      int m = system_.GetMainMatrix().GetNumColumns();
      result |= system_.SwapColumns(lhs + m, rhs + m);
    }
    return result;
  } else if (operation_type == OperationType::SwapColumns) {
    return system_.SwapColumns(lhs, rhs);
  }

  return false;
}